

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O2

size_t __thiscall ON_SubDHeap::SizeOfMeshFragmentsPool(ON_SubDHeap *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = ON_FixedSizePool::SizeOfPool(&this->m_fsp_full_fragments);
  sVar2 = ON_FixedSizePool::SizeOfPool(&this->m_fsp_part_fragments);
  sVar3 = ON_FixedSizePool::SizeOfPool(&this->m_fsp_oddball_fragments);
  sVar4 = ON_FixedSizePool::SizeOfPool(&this->m_fsp_limit_curves);
  return sVar4 + sVar3 + sVar2 + sVar1;
}

Assistant:

size_t SizeOfMeshFragmentsPool() const
  {
    return 
      m_fsp_full_fragments.SizeOfPool() 
      + m_fsp_part_fragments.SizeOfPool()
      + m_fsp_oddball_fragments.SizeOfPool()
      + m_fsp_limit_curves.SizeOfPool();
  }